

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int client_collected_extensions
              (ptls_t *tls,ptls_handshake_properties_t *properties,ptls_raw_extension_t *slots)

{
  byte bVar1;
  uint uVar2;
  uint8_t *src;
  quicly_cid_t *original_dcid_00;
  int iVar3;
  quicly_cid_t *retry_scid_00;
  long lVar4;
  quicly_cid_t *initial_scid_00;
  quicly_cid_t *pqVar5;
  quicly_transport_parameters_t *pqVar6;
  size_t *psVar7;
  bool bVar8;
  byte bVar9;
  quicly_cid_t retry_scid;
  quicly_cid_t initial_scid;
  quicly_cid_t original_dcid;
  quicly_transport_parameters_t params;
  
  bVar9 = 0;
  if ((properties->field_0).client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN) {
    __assert_fail("properties->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x841,
                  "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                 );
  }
  if (slots->type == 0xffa5) {
    if (slots[1].type != 0xffff) {
      __assert_fail("slots[1].type == UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x848,
                    "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    src = (slots->data).base;
    retry_scid.cid[0] = '\0';
    retry_scid.cid[1] = '\0';
    retry_scid.cid[2] = '\0';
    retry_scid.cid[3] = '\0';
    retry_scid.cid[4] = '\0';
    retry_scid.cid[5] = '\0';
    retry_scid.cid[6] = '\0';
    retry_scid.cid[7] = '\0';
    retry_scid.cid[8] = '\0';
    retry_scid.cid[9] = '\0';
    retry_scid.cid[10] = '\0';
    retry_scid.cid[0xb] = '\0';
    retry_scid.cid[0xc] = '\0';
    retry_scid.cid[0xd] = '\0';
    retry_scid.cid[0xe] = '\0';
    retry_scid.cid[0xf] = '\0';
    retry_scid.cid[0x10] = '\0';
    retry_scid.cid[0x11] = '\0';
    retry_scid.cid[0x12] = '\0';
    retry_scid.cid[0x13] = '\0';
    retry_scid.len = '\0';
    if (properties[-0xf].field_0.client.esni_keys.len != 0) {
      __assert_fail("remote_cid->sequence == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x851,
                    "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
    bVar8 = *(char *)((long)&properties[1].collect_extension + 4) == -1;
    retry_scid_00 = &retry_scid;
    if (bVar8) {
      retry_scid_00 = (quicly_cid_t *)0x0;
    }
    original_dcid_00 = &original_dcid;
    pqVar5 = (quicly_cid_t *)0x0;
    if (!bVar8) {
      pqVar5 = original_dcid_00;
    }
    initial_scid_00 = &initial_scid;
    if (*(uint *)((long)&properties[-8].field_0 + 0x58) < 0xff00001c) {
      initial_scid_00 = &_tp_cid_ignore;
      retry_scid_00 = &_tp_cid_ignore;
      original_dcid_00 = pqVar5;
    }
    iVar3 = quicly_decode_transport_parameter_list
                      (&params,original_dcid_00,initial_scid_00,retry_scid_00,
                       (void *)((long)&properties[-0xf].field_0 + 0x55),src,src + (slots->data).len,
                       (uint)(*(long *)((long)properties[-0x12].field_0.server.cookie.key + 0x68) !=
                             -1));
    if (iVar3 == 0) {
      uVar2 = *(uint *)((long)&properties[-8].field_0 + 0x58);
      if ((0xff00001b < uVar2) || (*(char *)((long)&properties[1].collect_extension + 4) != -1)) {
        if (*(uint8_t *)((long)&properties[-0xc].field_0 + 100) != original_dcid.len) {
          return 0x20008;
        }
        iVar3 = bcmp((void *)((long)&properties[-0xc].field_0 + 0x50),&original_dcid,
                     (ulong)original_dcid.len);
        if (iVar3 != 0) {
          return 0x20008;
        }
        if (0xff00001b < uVar2) {
          if (*(uint8_t *)((long)&properties[-0xf].field_0 + 0x54) != initial_scid.len) {
            return 0x20008;
          }
          iVar3 = bcmp((void *)((long)&properties[-0xf].field_0 + 0x40),&initial_scid,
                       (ulong)initial_scid.len);
          if (iVar3 != 0) {
            return 0x20008;
          }
          bVar1 = *(byte *)((long)&properties[1].collect_extension + 4);
          if ((ulong)bVar1 != 0xff) {
            if (bVar1 != retry_scid.len) {
              return 0x20008;
            }
            iVar3 = bcmp((void *)((long)&properties[1].field_0 + 0x60),&retry_scid,(ulong)bVar1);
            if (iVar3 != 0) {
              return 0x20008;
            }
          }
        }
      }
      if (((properties->field_0).client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTED) ||
         ((((iVar3 = 0x20008, properties[-0xd].collect_extension <= params.max_data &&
            (properties[-0xd].field_0.server.cookie.additional_data.len <=
             params.max_stream_data.bidi_local)) &&
           (*(ulong *)((long)&properties[-0xd].field_0 + 0x60) <= params.max_stream_data.bidi_remote
           )) && (((properties[-0xd].additional_extensions <= params.max_stream_data.uni &&
                   (properties[-0xc].field_0.client.negotiated_protocols.list <=
                    params.max_streams_bidi)) &&
                  (properties[-0xc].field_0.client.negotiated_protocols.count <=
                   params.max_streams_uni)))))) {
        pqVar6 = &params;
        psVar7 = &properties[-0xd].field_0.server.cookie.additional_data.len;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          *psVar7 = (pqVar6->max_stream_data).bidi_local;
          pqVar6 = (quicly_transport_parameters_t *)((long)pqVar6 + (ulong)bVar9 * -0x10 + 8);
          psVar7 = psVar7 + (ulong)bVar9 * -2 + 1;
        }
        ack_frequency_set_next_update_at((quicly_conn_t *)&properties[-0x12].field_0.server.cookie);
        iVar3 = 0;
      }
    }
  }
  else {
    iVar3 = 0x6d;
    if (slots->type != 0xffff) {
      __assert_fail("slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x847,
                    "int client_collected_extensions(ptls_t *, ptls_handshake_properties_t *, ptls_raw_extension_t *)"
                   );
    }
  }
  return iVar3;
}

Assistant:

static int client_collected_extensions(ptls_t *tls, ptls_handshake_properties_t *properties, ptls_raw_extension_t *slots)
{
    quicly_conn_t *conn = (void *)((char *)properties - offsetof(quicly_conn_t, crypto.handshake_properties));
    int ret;

    assert(properties->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);

    if (slots[0].type == UINT16_MAX) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }
    assert(slots[0].type == QUICLY_TLS_EXTENSION_TYPE_TRANSPORT_PARAMETERS);
    assert(slots[1].type == UINT16_MAX);

    const uint8_t *src = slots[0].data.base, *end = src + slots[0].data.len;
    quicly_transport_parameters_t params;
    quicly_cid_t original_dcid, initial_scid, retry_scid = {};

    /* obtain pointer to initial CID of the peer. It is guaranteeed to exist in the first slot, as TP is received before any frame
     * that updates the CID set. */
    quicly_remote_cid_t *remote_cid = &conn->super.remote.cid_set.cids[0];
    assert(remote_cid->sequence == 0);

    /* decode */
    if ((ret = quicly_decode_transport_parameter_list(&params, needs_cid_auth(conn) || is_retry(conn) ? &original_dcid : NULL,
                                                      needs_cid_auth(conn) ? &initial_scid : &tp_cid_ignore,
                                                      needs_cid_auth(conn) ? is_retry(conn) ? &retry_scid : NULL : &tp_cid_ignore,
                                                      remote_cid->stateless_reset_token, src, end, recognize_delayed_ack(conn))) !=
        0)
        goto Exit;

    /* validate CIDs */
    if (needs_cid_auth(conn) || is_retry(conn)) {
        if (!quicly_cid_is_equal(&conn->super.original_dcid, ptls_iovec_init(original_dcid.cid, original_dcid.len))) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
    }
    if (needs_cid_auth(conn)) {
        if (!quicly_cid_is_equal(&remote_cid->cid, ptls_iovec_init(initial_scid.cid, initial_scid.len))) {
            ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
            goto Exit;
        }
        if (is_retry(conn)) {
            if (!quicly_cid_is_equal(&conn->retry_scid, ptls_iovec_init(retry_scid.cid, retry_scid.len))) {
                ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;
                goto Exit;
            }
        }
    }

    if (properties->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED) {
#define ZERORTT_VALIDATE(x)                                                                                                        \
    if (params.x < conn->super.remote.transport_params.x) {                                                                        \
        ret = QUICLY_TRANSPORT_ERROR_TRANSPORT_PARAMETER;                                                                          \
        goto Exit;                                                                                                                 \
    }
        ZERORTT_VALIDATE(max_data);
        ZERORTT_VALIDATE(max_stream_data.bidi_local);
        ZERORTT_VALIDATE(max_stream_data.bidi_remote);
        ZERORTT_VALIDATE(max_stream_data.uni);
        ZERORTT_VALIDATE(max_streams_bidi);
        ZERORTT_VALIDATE(max_streams_uni);
#undef ZERORTT_VALIDATE
    }

    /* store the results */
    conn->super.remote.transport_params = params;
    ack_frequency_set_next_update_at(conn);

Exit:
    return ret; /* negative error codes used to transmit QUIC errors through picotls */
}